

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  double dVar1;
  int i;
  long lVar2;
  char *format;
  int iVar3;
  double y;
  int local_20;
  int width;
  
  if (_glfwInitialized == '\0') {
    iVar3 = 0x10001;
    format = (char *)0x0;
  }
  else {
    if (mode == 0x33003) {
      if (handle[0x41] == (GLFWwindow)(value != 0)) {
        return;
      }
      if (value == 0) {
        for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
          if (handle[lVar2 + 0x5c] == (GLFWwindow)0x3) {
            handle[lVar2 + 0x5c] = (GLFWwindow)0x0;
          }
        }
      }
      handle[0x41] = (GLFWwindow)(value != 0);
      return;
    }
    if (mode == 0x33002) {
      if (handle[0x40] == (GLFWwindow)(value != 0)) {
        return;
      }
      if (value == 0) {
        for (lVar2 = 100; lVar2 != 0x1c1; lVar2 = lVar2 + 1) {
          if (handle[lVar2] == (GLFWwindow)0x3) {
            handle[lVar2] = (GLFWwindow)0x0;
          }
        }
      }
      handle[0x40] = (GLFWwindow)(value != 0);
      return;
    }
    if (mode == 0x33001) {
      if (0xfffffffc < value - 0x34004U) {
        iVar3 = *(int *)(handle + 0x58);
        if (iVar3 == value) {
          return;
        }
        *(int *)(handle + 0x58) = value;
        if (_glfw.cursorWindow != (_GLFWwindow *)handle) {
          return;
        }
        y = _glfw.cursorPosY;
        dVar1 = _glfw.cursorPosX;
        if (iVar3 != 0x34003) {
          if (value != 0x34003) goto LAB_00107f76;
          _glfwPlatformGetCursorPos((_GLFWwindow *)handle,&_glfw.cursorPosX,&_glfw.cursorPosY);
          dVar1 = _glfw.cursorPosY;
          *(double *)(handle + 0x48) = _glfw.cursorPosX;
          *(double *)(handle + 0x50) = dVar1;
          _glfwPlatformGetWindowSize((_GLFWwindow *)handle,&width,&local_20);
          y = (double)(local_20 / 2);
          dVar1 = (double)(width / 2);
        }
        _glfwPlatformSetCursorPos((_GLFWwindow *)handle,dVar1,y);
LAB_00107f76:
        _glfwPlatformApplyCursorMode((_GLFWwindow *)handle);
        return;
      }
      format = "Invalid cursor mode";
    }
    else {
      format = "Invalid input mode";
    }
    iVar3 = 0x10003;
  }
  _glfwInputError(iVar3,format);
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    switch (mode)
    {
        case GLFW_CURSOR:
            setCursorMode(window, value);
            break;
        case GLFW_STICKY_KEYS:
            setStickyKeys(window, value ? GL_TRUE : GL_FALSE);
            break;
        case GLFW_STICKY_MOUSE_BUTTONS:
            setStickyMouseButtons(window, value ? GL_TRUE : GL_FALSE);
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode");
            break;
    }
}